

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

MapcodeError
decodeExtension(DecodeRec *dec,int dividerx4,int dividery,int lon_offset4,int extremeLat32,
               int maxLon32)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  MapcodeError MVar5;
  size_t sVar6;
  MapcodeZone *pMVar7;
  byte *__s;
  int iVar8;
  int iVar9;
  byte bVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  __s = (byte *)dec->extension;
  sVar6 = strlen((char *)__s);
  if (8 < sVar6) {
    return ERR_EXTENSION_INVALID_LENGTH;
  }
  uVar11 = (ulong)*__s;
  if (*__s == 0) {
    dVar15 = 0.0;
    uVar12 = 1;
    bVar2 = true;
    dVar14 = 0.0;
    goto LAB_0016d401;
  }
  bVar2 = false;
  iVar8 = 0;
  iVar9 = 0;
  uVar3 = 1;
  do {
    uVar4 = uVar3;
    bVar1 = (&decodeChar_decode_chars)[uVar11];
    if ((char)bVar1 < '\0') {
      return ERR_EXTENSION_INVALID_CHARACTER;
    }
    if (bVar1 == 0x1e) {
      return ERR_EXTENSION_INVALID_CHARACTER;
    }
    bVar10 = __s[1];
    if ((ulong)bVar10 == 0) {
      __s = __s + 1;
      uVar11 = 0;
      bVar2 = true;
      uVar13 = 0;
      uVar12 = 0;
    }
    else {
      if ((bVar10 & 0xdf) == 0x5a) {
        return ERR_EXTENSION_INVALID_CHARACTER;
      }
      bVar10 = (&decodeChar_decode_chars)[bVar10];
      if ((char)bVar10 < '\0') {
        return ERR_EXTENSION_INVALID_CHARACTER;
      }
      uVar12 = bVar10 / 6;
      uVar13 = (uint)(byte)(bVar10 + (char)uVar12 * -6);
      uVar11 = (ulong)__s[2];
      __s = __s + 2;
    }
    bVar10 = bVar1 % 5;
    uVar3 = uVar4 * 0x1e;
    iVar9 = ((uint)bVar10 + (uint)bVar10) * 3 + iVar9 * 0x1e + uVar13;
    iVar8 = (uint)(byte)(bVar1 - bVar10) + iVar8 * 0x1e + uVar12;
  } while ((char)uVar11 != '\0');
  dVar14 = (double)iVar9;
  dVar15 = (double)iVar8;
  bVar2 = !bVar2;
  while (uVar12 = uVar3, uVar4 < 27000) {
LAB_0016d401:
    dividerx4 = dividerx4 * 0x1e;
    dividery = dividery * 0x1e;
    uVar3 = uVar12 * 0x1e;
    uVar4 = uVar12;
  }
  dVar16 = (double)dividerx4;
  dVar14 = dVar14 * dVar16;
  dVar17 = (double)dividery;
  dVar15 = dVar15 * dVar17;
  if (!bVar2) {
    dVar17 = (double)(dividery * 5);
    dVar16 = (double)(dividerx4 * 6);
  }
  dVar15 = (double)(dec->coord32).latMicroDeg * 810000.0 + dVar15;
  dVar14 = (double)lon_offset4 * 810000.0 +
           (double)((dec->coord32).lonMicroDeg << 2) * 810000.0 + dVar14;
  if (dividery < 0) {
    dVar18 = dVar15 + 1.0;
    dVar15 = dVar17 + dVar18;
  }
  else {
    dVar18 = dVar17 + dVar15;
  }
  dVar16 = dVar16 + dVar14;
  (dec->zone).fminx = dVar14;
  (dec->zone).fmaxx = dVar16;
  (dec->zone).fminy = dVar15;
  (dec->zone).fmaxy = dVar18;
  dVar17 = (double)maxLon32 * 3240000.0;
  if (dVar17 < dVar16) {
    (dec->zone).fmaxx = dVar17;
    dVar16 = dVar17;
  }
  dVar17 = (double)extremeLat32 * 810000.0;
  if (dividery < 0) {
    if (dVar17 <= dVar15) goto LAB_0016d529;
    pMVar7 = &dec->zone;
    dVar15 = dVar17;
  }
  else {
    if (dVar18 <= dVar17) goto LAB_0016d529;
    pMVar7 = (MapcodeZone *)&(dec->zone).fmaxy;
    dVar18 = dVar17;
  }
  pMVar7->fminy = dVar17;
LAB_0016d529:
  MVar5 = ERR_EXTENSION_UNDECODABLE;
  if ((dVar14 < dVar16) && (MVar5 = ERR_EXTENSION_UNDECODABLE, dVar15 < dVar18)) {
    MVar5 = ERR_OK;
  }
  return MVar5;
}

Assistant:

static enum MapcodeError decodeExtension(DecodeRec *dec,
                                         int dividerx4, int dividery,
                                         const int lon_offset4,
                                         const int extremeLat32, const int maxLon32) {
    double lat1, lon4;
    const char *extrapostfix = dec->extension;
    int lon32 = 0;
    int lat32 = 0;
    int processor = 1;
    int odd = 0;
    ASSERT(dec);
    if (strlen(extrapostfix) > MAX_PRECISION_DIGITS) {
        return ERR_EXTENSION_INVALID_LENGTH;
    }
    while (*extrapostfix) {
        int column1, row1, column2, row2;
        const int c1 = decodeChar(*extrapostfix++);
        if (c1 < 0 || c1 == 30) {
            return ERR_EXTENSION_INVALID_CHARACTER;
        } // illegal extension character
        row1 = (c1 / 5);
        column1 = (c1 % 5);
        if (*extrapostfix) {
            const int c2 = decodeChar(*extrapostfix++);
            if (c2 < 0 || c2 == 30) {
                return ERR_EXTENSION_INVALID_CHARACTER;
            } // illegal extension character
            row2 = (c2 / 6);
            column2 = (c2 % 6);
        } else {
            odd = 1;
            row2 = 0;
            column2 = 0;
        }

        processor *= 30;
        lon32 = lon32 * 30 + column1 * 6 + column2;
        lat32 = lat32 * 30 + row1 * 5 + row2;
    }

    while (processor < MAX_PRECISION_FACTOR) {
        dividerx4 *= 30;
        dividery *= 30;
        processor *= 30;
    }

    lon4 = (dec->coord32.lonMicroDeg * 4 * (double) MAX_PRECISION_FACTOR) + ((lon32 * (double) dividerx4)) +
           (lon_offset4 * (double) MAX_PRECISION_FACTOR);
    lat1 = (dec->coord32.latMicroDeg * (double) MAX_PRECISION_FACTOR) + ((lat32 * (double) dividery));

    // determine the range of coordinates that are encoded to this mapcode
    if (odd) {
        setFromFractions(&dec->zone, lat1, lon4, 5 * dividery, 6 * dividerx4);
    } else {
        setFromFractions(&dec->zone, lat1, lon4, dividery, dividerx4);
    }

    // restrict the coordinate range to the extremes that were provided
    if (dec->zone.fmaxx > maxLon32 * MICROLON_TO_FRACTIONS_FACTOR) {
        dec->zone.fmaxx = maxLon32 * MICROLON_TO_FRACTIONS_FACTOR;
    }
    if (dividery >= 0) {
        if (dec->zone.fmaxy > extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR) {
            dec->zone.fmaxy = extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR;
        }
    } else {
        if (dec->zone.fminy < extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR) {
            dec->zone.fminy = extremeLat32 * MICROLAT_TO_FRACTIONS_FACTOR;
        }
    }
    if (isEmpty(&dec->zone)) {
        return ERR_EXTENSION_UNDECODABLE;
    }
    return ERR_OK;
}